

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O3

bool genVulkanFunctionsH(QList<VkSpecParser::Command> *commands,
                        QMap<QString,_QList<QString>_> *versionCommandMapping,QString *licHeaderFn,
                        QString *outputBase)

{
  QString *pQVar1;
  char cVar2;
  char cVar3;
  char *pcVar4;
  Command *c;
  Command *c_00;
  QString *pQVar5;
  QArrayData *key;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  QString local_108;
  QString local_f0;
  QByteArray local_d8;
  QArrayDataPointer<QString> local_c0;
  QString local_a8;
  QStringBuilder<const_QString_&,_QString> local_88;
  QString local_68;
  QByteArray local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_88.b.d.d = (Data *)0x0;
  local_88.b.d.ptr = L".h";
  local_88.b.d.size = 2;
  local_88.a = outputBase;
  QStringBuilder<const_QString_&,_QString>::convertTo<QString>(&local_68,&local_88);
  QFile::QFile((QFile *)&local_48,&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_88.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.b.d.d)->super_QArrayData,2,0x10);
    }
  }
  cVar2 = QFile::open(&local_48,0x12);
  if (cVar2 == '\0') {
    genVulkanFunctionsH();
  }
  else {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (char16_t *)0x0;
    local_68.d.size = 0;
    local_a8.d.size = 0;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    if (VERSIONS.d.size != 0) {
      pQVar1 = VERSIONS.d.ptr + VERSIONS.d.size;
      key = (QArrayData *)VERSIONS.d.ptr;
      do {
        local_88.a = (QString *)0x0;
        local_88.b.d.d = (Data *)0x0;
        local_88.b.d.ptr = (char16_t *)0x0;
        QMap<QString,_QList<QString>_>::value
                  ((QList<QString> *)&local_c0,versionCommandMapping,(QString *)key,
                   (QList<QString> *)&local_88);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_88);
        local_88.a = (QString *)(anon_var_dwarf_19740 + 1);
        local_88.b.d.ptr = L"\n";
        local_88.b.d.d = (Data *)key;
        operator+=(&local_68,
                   (QStringBuilder<QStringBuilder<const_char_(&)[5],_const_QString_&>,_const_char_(&)[2]>
                    *)&local_88);
        local_88.a = (QString *)(anon_var_dwarf_19740 + 1);
        local_88.b.d.ptr = L"\n";
        local_88.b.d.d = (Data *)key;
        operator+=(&local_a8,
                   (QStringBuilder<QStringBuilder<const_char_(&)[5],_const_QString_&>,_const_char_(&)[2]>
                    *)&local_88);
        lVar6 = (commands->d).size;
        if (lVar6 != 0) {
          c_00 = (commands->d).ptr;
          lVar6 = lVar6 * 0x68;
          do {
            QVar7.m_data = (c_00->cmd).name.d.ptr;
            QVar7.m_size = (c_00->cmd).name.d.size;
            cVar3 = QtPrivate::QStringList_contains((QList *)&local_c0,QVar7,CaseSensitive);
            if (cVar3 != '\0') {
              pQVar5 = &local_68;
              if (c_00->deviceLevel != false) {
                pQVar5 = &local_a8;
              }
              local_88.a = (QString *)0x0;
              local_88.b.d.d = (Data *)0x10b22c;
              local_88.b.d.ptr = (char16_t *)0x4;
              QString::append(pQVar5);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
              funcSig((QString *)&local_88,c_00,(char *)0x0);
              QString::append(pQVar5);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
              local_88.a = (QString *)0x0;
              local_88.b.d.d = (Data *)0x10b1c4;
              local_88.b.d.ptr = (char16_t *)0x2;
              QString::append(pQVar5);
              if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
                LOCK();
                (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
                     (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate((QArrayData *)local_88.a,2,0x10);
                }
              }
            }
            c_00 = c_00 + 1;
            lVar6 = lVar6 + -0x68;
          } while (lVar6 != 0);
        }
        QString::append(&local_68,"#endif\n",7);
        QString::append(&local_a8,"#endif\n",7);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_c0);
        key = (QArrayData *)&key[1].alloc;
      } while (key != (QArrayData *)pQVar1);
    }
    Preamble::get(&local_d8,&preamble,licHeaderFn);
    pcVar4 = local_d8.d.ptr;
    if (local_d8.d.ptr == (char *)0x0) {
      pcVar4 = (char *)&QByteArray::_empty;
    }
    QString::toUtf8_helper(&local_f0);
    if (local_f0.d.ptr == (char16_t *)0x0) {
      local_f0.d.ptr = (char16_t *)&QByteArray::_empty;
    }
    QString::toUtf8_helper(&local_108);
    if (local_108.d.ptr == (char16_t *)0x0) {
      local_108.d.ptr = (char16_t *)&QByteArray::_empty;
    }
    QString::asprintf((char *)&local_c0,
                      "%s\n#ifndef QVULKANFUNCTIONS_H\n#define QVULKANFUNCTIONS_H\n\n#if 0\n#pragma qt_no_master_include\n#endif\n\n#include <QtGui/qtguiglobal.h>\n\n#if QT_CONFIG(vulkan) || defined(Q_QDOC)\n\n#ifndef VK_NO_PROTOTYPES\n#define VK_NO_PROTOTYPES\n#endif\n#include <vulkan/vulkan.h>\n\n#include <QtCore/qscopedpointer.h>\n\nQT_BEGIN_NAMESPACE\n\nclass QVulkanInstance;\nclass QVulkanFunctionsPrivate;\nclass QVulkanDeviceFunctionsPrivate;\n\nclass Q_GUI_EXPORT QVulkanFunctions\n{\npublic:\n    ~QVulkanFunctions();\n\n%s\nprivate:\n    Q_DISABLE_COPY(QVulkanFunctions)\n    QVulkanFunctions(QVulkanInstance *inst);\n\n    QScopedPointer<QVulkanFunctionsPrivate> d_ptr;\n    friend class QVulkanInstance;\n};\n\nclass Q_GUI_EXPORT QVulkanDeviceFunctions\n{\npublic:\n    ~QVulkanDeviceFunctions();\n\n%s\nprivate:\n    Q_DISABLE_COPY(QVulkanDeviceFunctions)\n    QVulkanDeviceFunctions(QVulkanInstance *inst, VkDevice device);\n\n    QScopedPointer<QVulkanDeviceFunctionsPrivate> d_ptr;\n    friend class QVulkanInstance;\n};\n\nQT_END_NAMESPACE\n\n#endif // QT_CONFIG(vulkan) || defined(Q_QDOC)\n\n#endif // QVULKANFUNCTIONS_H\n"
                      ,pcVar4,local_f0.d.ptr,local_108.d.ptr);
    QString::toUtf8_helper((QString *)&local_88);
    QIODevice::write(&local_48);
    if ((QArrayData *)local_88.a != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_88.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_88.a,1,0x10);
      }
    }
    if (&(local_c0.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c0.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_48.d.size) {
    __stack_chk_fail();
  }
  return (bool)cVar2;
}

Assistant:

bool genVulkanFunctionsH(const QList<VkSpecParser::Command> &commands,
                         const QMap<QString, QStringList> &versionCommandMapping,
                         const QString &licHeaderFn,
                         const QString &outputBase)
{
    QFile f(outputBase + QStringLiteral(".h"));
    if (!f.open(QIODevice::WriteOnly | QIODevice::Text)) {
        qWarning("Failed to write %s", qPrintable(f.fileName()));
        return false;
    }

    static const char *s =
"%s\n"
"#ifndef QVULKANFUNCTIONS_H\n"
"#define QVULKANFUNCTIONS_H\n"
"\n"
"#if 0\n"
"#pragma qt_no_master_include\n"
"#endif\n"
"\n"
"#include <QtGui/qtguiglobal.h>\n"
"\n"
"#if QT_CONFIG(vulkan) || defined(Q_QDOC)\n"
"\n"
"#ifndef VK_NO_PROTOTYPES\n"
"#define VK_NO_PROTOTYPES\n"
"#endif\n"
"#include <vulkan/vulkan.h>\n"
"\n"
"#include <QtCore/qscopedpointer.h>\n"
"\n"
"QT_BEGIN_NAMESPACE\n"
"\n"
"class QVulkanInstance;\n"
"class QVulkanFunctionsPrivate;\n"
"class QVulkanDeviceFunctionsPrivate;\n"
"\n"
"class Q_GUI_EXPORT QVulkanFunctions\n"
"{\n"
"public:\n"
"    ~QVulkanFunctions();\n"
"\n"
"%s\n"
"private:\n"
"    Q_DISABLE_COPY(QVulkanFunctions)\n"
"    QVulkanFunctions(QVulkanInstance *inst);\n"
"\n"
"    QScopedPointer<QVulkanFunctionsPrivate> d_ptr;\n"
"    friend class QVulkanInstance;\n"
"};\n"
"\n"
"class Q_GUI_EXPORT QVulkanDeviceFunctions\n"
"{\n"
"public:\n"
"    ~QVulkanDeviceFunctions();\n"
"\n"
"%s\n"
"private:\n"
"    Q_DISABLE_COPY(QVulkanDeviceFunctions)\n"
"    QVulkanDeviceFunctions(QVulkanInstance *inst, VkDevice device);\n"
"\n"
"    QScopedPointer<QVulkanDeviceFunctionsPrivate> d_ptr;\n"
"    friend class QVulkanInstance;\n"
"};\n"
"\n"
"QT_END_NAMESPACE\n"
"\n"
"#endif // QT_CONFIG(vulkan) || defined(Q_QDOC)\n"
"\n"
"#endif // QVULKANFUNCTIONS_H\n";

    QString instCmdStr;
    QString devCmdStr;
    for (const QString &version : VERSIONS) {
        const QStringList &coreFunctionsInVersion = versionCommandMapping[version];
        instCmdStr += "#if " + version + "\n";
        devCmdStr += "#if " + version + "\n";
        for (const VkSpecParser::Command &c : commands) {
            if (!coreFunctionsInVersion.contains(c.cmd.name))
                continue;

            QString *dst = c.deviceLevel ? &devCmdStr : &instCmdStr;
            *dst += QStringLiteral("    ");
            *dst += funcSig(c);
            *dst += QStringLiteral(";\n");
        }
        instCmdStr += "#endif\n";
        devCmdStr += "#endif\n";
    }

    f.write(QString::asprintf(s, preamble.get(licHeaderFn).constData(),
                              instCmdStr.toUtf8().constData(),
                              devCmdStr.toUtf8().constData()).toUtf8());

    return true;
}